

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O3

void duckdb::roaring::RoaringCompressState::HandleNoneValid
               (RoaringCompressState *state,idx_t amount)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  
  uVar2 = (state->container_state).length;
  if (uVar2 != 0) {
    if ((state->container_state).last_bit_set != true) goto LAB_016f2b7e;
    (*(state->container_state).append_function)(&state->container_state,false,uVar2);
    (state->container_state).last_is_null = false;
    puVar1 = &(state->container_state).appended_count;
    *puVar1 = *puVar1 + uVar2;
  }
  uVar2 = 0;
LAB_016f2b7e:
  (state->container_state).length = uVar2 + (short)amount;
  (state->container_state).last_bit_set = false;
  return;
}

Assistant:

void RoaringCompressState::HandleNoneValid(RoaringCompressState &state, idx_t amount) {
	auto &container_state = state.container_state;
	if (container_state.length && container_state.last_bit_set == true) {
		container_state.Append(!container_state.last_bit_set, container_state.length);
		container_state.length = 0;
	}
	container_state.length += amount;
	container_state.last_bit_set = false;
}